

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-client.c
# Opt level: O2

int lws_client_create_tls(lws *wsi,char **pcce,int do_c1)

{
  lws_context *plVar1;
  lws_vhost *plVar2;
  bool bVar3;
  bool bVar4;
  lws_ssl_capable_status lVar5;
  int iVar6;
  lws_usec_t lVar7;
  char *pcVar8;
  lws *plVar9;
  lws_vhost **pplVar10;
  ulong uVar11;
  
  if (((wsi->tls).use_ssl & 1) == 0) {
    (wsi->tls).ssl = (lws_tls_conn *)0x0;
  }
  else {
    if ((wsi->tls).ssl == (lws_tls_conn *)0x0) {
      if ((wsi->field_0x474 & 0x20) == 0) {
        iVar6 = lws_tls_restrict_borrow((wsi->a).context);
        if (iVar6 != 0) {
          pcVar8 = "tls restriction limit";
          goto LAB_00114f4a;
        }
        wsi->field_0x474 = wsi->field_0x474 | 1;
        plVar1 = (wsi->a).context;
        if (plVar1->ssl_handshake_serialize != 0) {
          pplVar10 = &plVar1->vhost_list;
          while (plVar2 = *pplVar10, plVar2 != (lws_vhost *)0x0) {
            for (uVar11 = 0; uVar11 < plVar1->pt[0].fds_count; uVar11 = uVar11 + 1) {
              plVar9 = wsi_from_fd(plVar1,plVar1->pt[0].fds[uVar11].fd);
              if ((((plVar9 != (lws *)0x0) && (plVar9->tsi == '\0')) && (plVar9 != wsi)) &&
                 (((plVar9->a).vhost == plVar2 && ((short)plVar9->wsistate != 0x20)))) {
                lws_tls_restrict_return((wsi->a).context);
                wsi->field_0x474 = wsi->field_0x474 & 0xfe;
                pcVar8 = "ssl handshake serialization";
                goto LAB_00114f4a;
              }
            }
            pplVar10 = &plVar2->vhost_next;
          }
        }
      }
      iVar6 = lws_ssl_client_bio_create(wsi);
      if (iVar6 < 0) {
        pcVar8 = "bio_create failed";
        goto LAB_00114f4a;
      }
    }
    if (do_c1 != 0) {
      lVar7 = lws_now_usecs();
      wsi->conmon_datum = lVar7;
      plVar1 = (wsi->a).context;
      lVar5 = lws_tls_client_connect
                        (wsi,(char *)plVar1->pt[wsi->tsi].serv_buf,(ulong)plVar1->pt_serv_buf_size);
      uVar11 = 0;
      switch(lVar5) {
      case LWS_SSL_CAPABLE_DONE:
        lVar7 = lws_now_usecs();
        (wsi->conmon).ciu_tls = (int)lVar7 - (int)wsi->conmon_datum;
        bVar3 = false;
        bVar4 = false;
        uVar11 = 1;
        break;
      case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
        lws_callback_on_writable(wsi);
      case LWS_SSL_CAPABLE_MORE_SERVICE:
      case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
        lwsi_set_state(wsi,0x204);
      default:
        bVar3 = true;
        bVar4 = false;
        break;
      case LWS_SSL_CAPABLE_ERROR:
        bVar4 = true;
        bVar3 = false;
        uVar11 = (ulong)(uint)lVar5;
      }
      _lws_log(0x10,"%s: lws_ssl_client_connect1: %d\n","lws_client_create_tls",uVar11);
      if (bVar3) {
        return 1;
      }
      if (bVar4) {
        pcVar8 = (char *)((wsi->a).context)->pt[wsi->tsi].serv_buf;
LAB_00114f4a:
        *pcce = pcVar8;
        return -1;
      }
      lws_tls_server_conn_alpn(wsi);
    }
  }
  return 0;
}

Assistant:

int
lws_client_create_tls(struct lws *wsi, const char **pcce, int do_c1)
{
	/* we can retry this... just cook the SSL BIO the first time */

	if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {
		int n;

		if (!wsi->tls.ssl) {

#if defined(LWS_WITH_TLS)
			if (!wsi->transaction_from_pipeline_queue) {
				if (lws_tls_restrict_borrow(wsi->a.context)) {
					*pcce = "tls restriction limit";
					return CCTLS_RETURN_ERROR;
				}
				wsi->tls_borrowed = 1;
				if (wsi->a.context->ssl_handshake_serialize) {
					if (lws_ssl_handshake_serialize(wsi->a.context, wsi)) {
						lws_tls_restrict_return(wsi->a.context);
						wsi->tls_borrowed = 0;
						*pcce = "ssl handshake serialization";
						return CCTLS_RETURN_ERROR;
					}
				}
			}
#endif

			if (lws_ssl_client_bio_create(wsi) < 0) {
				*pcce = "bio_create failed";
				return CCTLS_RETURN_ERROR;
			}
		}

		if (!do_c1)
			return CCTLS_RETURN_DONE;

		lws_metrics_caliper_report(wsi->cal_conn, METRES_GO);
		lws_metrics_caliper_bind(wsi->cal_conn, wsi->a.context->mt_conn_tls);
#if defined(LWS_WITH_CONMON)
		wsi->conmon_datum = lws_now_usecs();
#endif

		n = lws_ssl_client_connect1(wsi, (char *)wsi->a.context->pt[(int)wsi->tsi].serv_buf,
					    wsi->a.context->pt_serv_buf_size);
		lwsl_debug("%s: lws_ssl_client_connect1: %d\n", __func__, n);
		if (!n)
			return CCTLS_RETURN_RETRY; /* caller should return 0 */

		if (n < 0) {
			*pcce = (const char *)wsi->a.context->pt[(int)wsi->tsi].serv_buf;
			lws_metrics_caliper_report(wsi->cal_conn, METRES_NOGO);
			return CCTLS_RETURN_ERROR;
		}
		/* ...connect1 already handled caliper if SSL_accept done */

		lws_tls_server_conn_alpn(wsi);

	} else
		wsi->tls.ssl = NULL;

	return CCTLS_RETURN_DONE; /* OK */
}